

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

Type ON_BinaryArchive::TableComponentType(ON_3dmArchiveTableType table_type)

{
  undefined1 local_d;
  Type model_component_type;
  ON_3dmArchiveTableType table_type_local;
  
  if (table_type == Unset) {
    local_d = Unset;
  }
  else if (table_type == start_section) {
    local_d = Unset;
  }
  else if (table_type == properties_table) {
    local_d = Unset;
  }
  else if (table_type == settings_table) {
    local_d = Unset;
  }
  else if (table_type == bitmap_table) {
    local_d = Image;
  }
  else if (table_type == texture_mapping_table) {
    local_d = TextureMapping;
  }
  else if (table_type == material_table) {
    local_d = Material;
  }
  else if (table_type == linetype_table) {
    local_d = LinePattern;
  }
  else if (table_type == layer_table) {
    local_d = Layer;
  }
  else if (table_type == group_table) {
    local_d = Group;
  }
  else if (table_type == text_style_table) {
    local_d = TextStyle;
  }
  else if (table_type == leader_style_table) {
    local_d = Unset;
  }
  else if (table_type == dimension_style_table) {
    local_d = DimStyle;
  }
  else if (table_type == light_table) {
    local_d = RenderLight;
  }
  else if (table_type == hatchpattern_table) {
    local_d = HatchPattern;
  }
  else if (table_type == instance_definition_table) {
    local_d = InstanceDefinition;
  }
  else if (table_type == object_table) {
    local_d = ModelGeometry;
  }
  else if (table_type == historyrecord_table) {
    local_d = HistoryRecord;
  }
  else if (table_type == user_table) {
    local_d = Unset;
  }
  else if (table_type == end_mark) {
    local_d = Unset;
  }
  else {
    local_d = Unset;
  }
  return local_d;
}

Assistant:

ON_ModelComponent::Type ON_BinaryArchive::TableComponentType(
  ON_3dmArchiveTableType table_type
)
{
  ON_ModelComponent::Type model_component_type;
  switch (table_type)
  {
  case ON_3dmArchiveTableType::Unset:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::start_section:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::properties_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::settings_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::bitmap_table:
    model_component_type = ON_ModelComponent::Type::Image;
    break;
  case ON_3dmArchiveTableType::texture_mapping_table:
    model_component_type = ON_ModelComponent::Type::TextureMapping;
    break;
  case ON_3dmArchiveTableType::material_table:
    model_component_type = ON_ModelComponent::Type::RenderMaterial;
    break;
  case ON_3dmArchiveTableType::linetype_table:
    model_component_type = ON_ModelComponent::Type::LinePattern;
    break;
  case ON_3dmArchiveTableType::layer_table:
    model_component_type = ON_ModelComponent::Type::Layer;
    break;
  case ON_3dmArchiveTableType::group_table:
    model_component_type = ON_ModelComponent::Type::Group;
    break;
  case ON_3dmArchiveTableType::text_style_table:
    model_component_type = ON_ModelComponent::Type::TextStyle;
    break;
  case ON_3dmArchiveTableType::leader_style_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::dimension_style_table:
    model_component_type = ON_ModelComponent::Type::DimStyle;
    break;
  case ON_3dmArchiveTableType::light_table:
    model_component_type = ON_ModelComponent::Type::RenderLight;
    break;
  case ON_3dmArchiveTableType::hatchpattern_table:
    model_component_type = ON_ModelComponent::Type::HatchPattern;
    break;
  case ON_3dmArchiveTableType::instance_definition_table:
    model_component_type = ON_ModelComponent::Type::InstanceDefinition;
    break;
  case ON_3dmArchiveTableType::object_table:
    model_component_type = ON_ModelComponent::Type::ModelGeometry;
    break;
  case ON_3dmArchiveTableType::historyrecord_table:
    model_component_type = ON_ModelComponent::Type::HistoryRecord;
    break;
  case ON_3dmArchiveTableType::user_table:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  case ON_3dmArchiveTableType::end_mark:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  default:
    model_component_type = ON_ModelComponent::Type::Unset;
    break;
  }
  return model_component_type;
}